

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O0

string * muduo::ProcessInfo::hostname_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  char buf [256];
  allocator local_11d [20];
  allocator local_109;
  char local_108 [255];
  undefined1 local_9;
  
  iVar1 = gethostname(local_108,0x100);
  if (iVar1 == 0) {
    local_9 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,local_108,&local_109);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"unknownhost",local_11d);
    std::allocator<char>::~allocator((allocator<char> *)local_11d);
  }
  return in_RDI;
}

Assistant:

string ProcessInfo::hostname()
{
  // HOST_NAME_MAX 64
  // _POSIX_HOST_NAME_MAX 255
  char buf[256];
  if (::gethostname(buf, sizeof buf) == 0)
  {
    buf[sizeof(buf)-1] = '\0';
    return buf;
  }
  else
  {
    return "unknownhost";
  }
}